

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsCheckBitConst0(Wlc_Ntk_t *p,int NameId)

{
  int iVar1;
  uint *p_00;
  int *pInits;
  Wlc_Obj_t *pObj;
  int NameId_local;
  Wlc_Ntk_t *p_local;
  
  pInits = (int *)Wlc_NtkObj(p,NameId);
  iVar1 = Wlc_ObjRange((Wlc_Obj_t *)pInits);
  if (iVar1 == 1) {
    while ((*pInits & 0x3f) == 7) {
      iVar1 = Wlc_ObjFaninId0((Wlc_Obj_t *)pInits);
      pInits = (int *)Wlc_NtkObj(p,iVar1);
    }
    if ((*pInits & 0x3f) == 6) {
      p_00 = (uint *)Wlc_ObjConstValue((Wlc_Obj_t *)pInits);
      iVar1 = Abc_InfoHasBit(p_00,0);
      p_local._4_4_ = (uint)(iVar1 == 0);
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Wlc_PrsCheckBitConst0( Wlc_Ntk_t * p, int NameId )
{
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, NameId );
    int * pInits;
    if ( Wlc_ObjRange(pObj) != 1 )
        return 0;
    while ( pObj->Type == WLC_OBJ_BUF )
        pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
    if ( pObj->Type != WLC_OBJ_CONST )
        return 0;
    pInits = Wlc_ObjConstValue(pObj);
    return Abc_InfoHasBit((unsigned *)pInits, 0) == 0;
}